

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR subelems_allocator(lysp_yin_ctx *ctx,size_t count,lysp_node *parent,yin_subelement **result,
                         ...)

{
  char in_AL;
  import_meta *imp_meta;
  yin_subelement *pyVar1;
  undefined8 *puVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  size_t sVar8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  pyVar1 = (yin_subelement *)calloc(count,0x18);
  *result = pyVar1;
  if (pyVar1 != (yin_subelement *)0x0) {
    local_100 = &ap[0].overflow_arg_area;
    uVar4 = 0x20;
    if (count != 0) {
      lVar7 = 0;
      sVar8 = count;
      do {
        uVar6 = (ulong)uVar4;
        if (uVar6 < 0x29) {
          uVar4 = uVar4 + 8;
          ppvVar3 = (void **)((long)local_e8 + uVar6);
        }
        else {
          ppvVar3 = local_100;
          local_100 = local_100 + 1;
        }
        iVar5 = *(int *)ppvVar3;
        pyVar1 = *result;
        *(int *)((long)&pyVar1->type + lVar7) = iVar5;
        if (iVar5 < 0x400) {
          if (iVar5 < 0x10) {
            switch(iVar5) {
            case 1:
            case 2:
            case 4:
            case 8:
              goto switchD_0018428a_caseD_1;
            default:
              goto switchD_0018428a_caseD_3;
            }
          }
          if (0x7f < iVar5) {
            if (((iVar5 != 0x80) && (iVar5 != 0x100)) && (iVar5 != 0x200))
            goto switchD_0018428a_caseD_3;
switchD_0018428a_caseD_1:
            puVar2 = (undefined8 *)calloc(1,0x10);
            if (puVar2 != (undefined8 *)0x0) {
              *puVar2 = parent;
              goto LAB_001842a7;
            }
LAB_0018436b:
            iVar5 = 2;
            goto LAB_00184370;
          }
          if ((iVar5 - 0x10U < 0x31) &&
             ((0x1000000010001U >> ((ulong)(iVar5 - 0x10U) & 0x3f) & 1) != 0))
          goto switchD_0018428a_caseD_1;
switchD_0018428a_caseD_3:
          uVar6 = (ulong)uVar4;
          if (uVar6 < 0x29) {
            uVar4 = uVar4 + 8;
            ppvVar3 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar3 = local_100;
            local_100 = local_100 + 1;
          }
          *(void **)((long)&pyVar1->dest + lVar7) = *ppvVar3;
        }
        else {
          if (iVar5 < 0x4000) {
            if (iVar5 < 0x1000) {
              if ((iVar5 != 0x400) && (iVar5 != 0x800)) goto switchD_0018428a_caseD_3;
            }
            else if ((iVar5 != 0x1000) && (iVar5 != 0x2000)) goto switchD_0018428a_caseD_3;
            goto switchD_0018428a_caseD_1;
          }
          if (iVar5 < 0x140000) {
            if ((iVar5 != 0x4000) && (iVar5 != 0x8000)) goto switchD_0018428a_caseD_3;
            goto switchD_0018428a_caseD_1;
          }
          if ((iVar5 != 0x140000) && (iVar5 != 0x150000)) {
            if (iVar5 != 0x2f0000) goto switchD_0018428a_caseD_3;
            goto switchD_0018428a_caseD_1;
          }
          puVar2 = (undefined8 *)calloc(1,0x10);
          if (puVar2 == (undefined8 *)0x0) goto LAB_0018436b;
          uVar6 = (ulong)uVar4;
          if (uVar6 < 0x29) {
            uVar4 = uVar4 + 8;
            ppvVar3 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar3 = local_100;
            local_100 = local_100 + 1;
          }
          *puVar2 = *ppvVar3;
LAB_001842a7:
          uVar6 = (ulong)uVar4;
          if (uVar6 < 0x29) {
            uVar4 = uVar4 + 8;
            ppvVar3 = (void **)((long)local_e8 + uVar6);
          }
          else {
            ppvVar3 = local_100;
            local_100 = local_100 + 1;
          }
          puVar2[1] = *ppvVar3;
          *(undefined8 **)((long)&pyVar1->dest + lVar7) = puVar2;
          iVar5 = 0;
LAB_00184370:
          if (puVar2 == (undefined8 *)0x0) goto LAB_001843ed;
        }
        uVar6 = (ulong)uVar4;
        if (uVar6 < 0x29) {
          uVar4 = uVar4 + 8;
          ppvVar3 = (void **)((long)local_e8 + uVar6);
        }
        else {
          ppvVar3 = local_100;
          local_100 = local_100 + 1;
        }
        *(undefined2 *)((long)&(*result)->flags + lVar7) = *(undefined2 *)ppvVar3;
        lVar7 = lVar7 + 0x18;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    iVar5 = 3;
LAB_001843ed:
    if (iVar5 != 2) {
      if (iVar5 == 3) {
        count = 0;
      }
      goto LAB_00184433;
    }
  }
  subelems_deallocator(count,*result);
  count = 1;
  ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","subelems_allocator");
LAB_00184433:
  return (LY_ERR)count;
}

Assistant:

static LY_ERR
subelems_allocator(struct lysp_yin_ctx *ctx, size_t count, struct lysp_node *parent,
        struct yin_subelement **result, ...)
{
    va_list ap;

    *result = calloc(count, sizeof **result);
    LY_CHECK_GOTO(!(*result), mem_err);

    va_start(ap, result);
    for (size_t i = 0; i < count; ++i) {
        /* TYPE */
        (*result)[i].type = va_arg(ap, enum ly_stmt);
        /* DEST */
        if (IS_NODE_ELEM((*result)[i].type)) {
            struct tree_node_meta *node_meta = NULL;

            node_meta = calloc(1, sizeof *node_meta);
            LY_CHECK_GOTO(!node_meta, mem_err);
            node_meta->parent = parent;
            node_meta->nodes = va_arg(ap, void *);
            (*result)[i].dest = node_meta;
        } else if ((*result)[i].type == LY_STMT_IMPORT) {
            struct import_meta *imp_meta = NULL;

            imp_meta = calloc(1, sizeof *imp_meta);
            LY_CHECK_GOTO(!imp_meta, mem_err);
            imp_meta->prefix = va_arg(ap, const char *);
            imp_meta->imports = va_arg(ap, struct lysp_import **);
            (*result)[i].dest = imp_meta;
        } else if ((*result)[i].type == LY_STMT_INCLUDE) {
            struct include_meta *inc_meta = NULL;

            inc_meta = calloc(1, sizeof *inc_meta);
            LY_CHECK_GOTO(!inc_meta, mem_err);
            inc_meta->name = va_arg(ap, const char *);
            inc_meta->includes = va_arg(ap, struct lysp_include **);
            (*result)[i].dest = inc_meta;
        } else if (((*result)[i].type == LY_STMT_INPUT) || ((*result)[i].type == LY_STMT_OUTPUT)) {
            struct inout_meta *inout_meta = NULL;

            inout_meta = calloc(1, sizeof *inout_meta);
            LY_CHECK_GOTO(!inout_meta, mem_err);
            inout_meta->parent = parent;
            inout_meta->inout_p = va_arg(ap, struct lysp_node_action_inout *);
            (*result)[i].dest = inout_meta;
        } else {
            (*result)[i].dest = va_arg(ap, void *);
        }
        /* FLAGS */
        (*result)[i].flags = va_arg(ap, int);
    }
    va_end(ap);

    return LY_SUCCESS;

mem_err:
    subelems_deallocator(count, *result);
    LOGMEM(ctx->xmlctx->ctx);
    return LY_EMEM;
}